

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O2

void Reverse(uint8_t *v,size_t start,size_t end)

{
  uint8_t uVar1;
  
  for (; end = end - 1, start < end; start = start + 1) {
    uVar1 = v[start];
    v[start] = v[end];
    v[end] = uVar1;
  }
  return;
}

Assistant:

static void Reverse(uint8_t* v, size_t start, size_t end) {
  --end;
  while (start < end) {
    uint8_t tmp = v[start];
    v[start] = v[end];
    v[end] = tmp;
    ++start;
    --end;
  }
}